

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

void LZ4_attach_dictionary(LZ4_stream_t *workingStream,LZ4_stream_t *dictionaryStream)

{
  LZ4_stream_t *pLVar1;
  
  LZ4_resetStream_fast(workingStream);
  if (dictionaryStream == (LZ4_stream_t *)0x0) {
    pLVar1 = (LZ4_stream_t *)0x0;
  }
  else {
    if ((workingStream->internal_donotuse).currentOffset == 0) {
      (workingStream->internal_donotuse).currentOffset = 0x10000;
    }
    pLVar1 = (LZ4_stream_t *)0x0;
    if ((dictionaryStream->internal_donotuse).dictSize != 0) {
      pLVar1 = dictionaryStream;
    }
  }
  workingStream->table[0x802] = (unsigned_long_long)pLVar1;
  return;
}

Assistant:

void LZ4_attach_dictionary(LZ4_stream_t* workingStream, const LZ4_stream_t* dictionaryStream) {
    const LZ4_stream_t_internal* dictCtx = dictionaryStream == NULL ? NULL :
        &(dictionaryStream->internal_donotuse);

    DEBUGLOG(4, "LZ4_attach_dictionary (%p, %p, size %u)",
             workingStream, dictionaryStream,
             dictCtx != NULL ? dictCtx->dictSize : 0);

    /* Calling LZ4_resetStream_fast() here makes sure that changes will not be
     * erased by subsequent calls to LZ4_resetStream_fast() in case stream was
     * marked as having dirty context, e.g. requiring full reset.
     */
    LZ4_resetStream_fast(workingStream);

    if (dictCtx != NULL) {
        /* If the current offset is zero, we will never look in the
         * external dictionary context, since there is no value a table
         * entry can take that indicate a miss. In that case, we need
         * to bump the offset to something non-zero.
         */
        if (workingStream->internal_donotuse.currentOffset == 0) {
            workingStream->internal_donotuse.currentOffset = 64 KB;
        }

        /* Don't actually attach an empty dictionary.
         */
        if (dictCtx->dictSize == 0) {
            dictCtx = NULL;
        }
    }
    workingStream->internal_donotuse.dictCtx = dictCtx;
}